

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

ImRect ImGui::GetWindowScrollbarRect(ImGuiWindow *window,ImGuiAxis axis)

{
  float fVar1;
  ImVec2 IVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  bool bVar5;
  undefined1 in_ZMM0 [64];
  undefined1 auVar7 [56];
  undefined1 auVar6 [64];
  undefined1 auVar9 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar11 [56];
  ImRect IVar12;
  undefined1 auVar10 [64];
  ImVec2 IVar8;
  
  auVar11 = in_ZMM1._8_56_;
  auVar7 = in_ZMM0._8_56_;
  IVar12 = ImGuiWindow::Rect(window);
  auVar10._0_8_ = IVar12.Max;
  auVar10._8_56_ = auVar11;
  auVar6._0_8_ = IVar12.Min;
  auVar6._8_56_ = auVar7;
  fVar1 = (&(window->ScrollbarSizes).x)[axis ^ ImGuiAxis_Y];
  if (axis == ImGuiAxis_X) {
    auVar9 = vmovshdup_avx(auVar10._0_16_);
    auVar3 = vmovshdup_avx(auVar6._0_16_);
    fVar1 = (auVar9._0_4_ - window->WindowBorderSize) - fVar1;
    uVar4 = vcmpss_avx512f(ZEXT416((uint)fVar1),auVar3,2);
    bVar5 = (bool)((byte)uVar4 & 1);
    auVar9._4_12_ = auVar10._4_12_;
    auVar9._0_4_ = (window->InnerRect).Max.x;
    IVar8 = auVar9._0_8_;
    auVar9 = vinsertps_avx(ZEXT416((uint)(window->InnerRect).Min.x),
                           ZEXT416((uint)bVar5 * auVar3._0_4_ + (uint)!bVar5 * (int)fVar1),0x10);
    IVar2 = auVar9._0_8_;
  }
  else {
    auVar9 = vinsertps_avx(auVar10._0_16_,ZEXT416((uint)(window->InnerRect).Max.y),0x10);
    IVar8 = auVar9._0_8_;
    fVar1 = (IVar12.Max.x - window->WindowBorderSize) - fVar1;
    uVar4 = vcmpss_avx512f(ZEXT416((uint)fVar1),auVar6._0_16_,2);
    bVar5 = (bool)((byte)uVar4 & 1);
    auVar9 = vinsertps_avx(ZEXT416((uint)bVar5 * (int)IVar12.Min.x + (uint)!bVar5 * (int)fVar1),
                           ZEXT416((uint)(window->InnerRect).Min.y),0x10);
    IVar2 = auVar9._0_8_;
  }
  IVar12.Max = IVar8;
  IVar12.Min = IVar2;
  return IVar12;
}

Assistant:

ImRect ImGui::GetWindowScrollbarRect(ImGuiWindow* window, ImGuiAxis axis)
{
    const ImRect outer_rect = window->Rect();
    const ImRect inner_rect = window->InnerRect;
    const float border_size = window->WindowBorderSize;
    const float scrollbar_size = window->ScrollbarSizes[axis ^ 1]; // (ScrollbarSizes.x = width of Y scrollbar; ScrollbarSizes.y = height of X scrollbar)
    IM_ASSERT(scrollbar_size > 0.0f);
    if (axis == ImGuiAxis_X)
        return ImRect(inner_rect.Min.x, ImMax(outer_rect.Min.y, outer_rect.Max.y - border_size - scrollbar_size), inner_rect.Max.x, outer_rect.Max.y);
    else
        return ImRect(ImMax(outer_rect.Min.x, outer_rect.Max.x - border_size - scrollbar_size), inner_rect.Min.y, outer_rect.Max.x, inner_rect.Max.y);
}